

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O1

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::delete_nodes(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
               *this,link_pointer prev,link_pointer end)

{
  link_pointer ppVar1;
  size_t count;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    ppVar1 = prev->next_ + -2;
    if (prev->next_ == (link_pointer)0x0) {
      ppVar1 = (link_pointer)0x0;
    }
    prev->next_ = ppVar1[2].next_;
    operator_delete(ppVar1,0x20);
    this->size_ = this->size_ - 1;
    sVar2 = sVar2 + 1;
  } while (prev->next_ != end);
  return sVar2;
}

Assistant:

std::size_t delete_nodes(link_pointer prev, link_pointer end)
        {
            BOOST_ASSERT(prev->next_ != end);

            std::size_t count = 0;

            do {
                delete_node(prev);
                ++count;
            } while (prev->next_ != end);

            return count;
        }